

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udbgutil.cpp
# Opt level: O3

int32_t stringToStringBuffer(char *target,int32_t targetCapacity,char *str,UErrorCode *status)

{
  int32_t iVar1;
  int32_t iVar2;
  size_t sVar3;
  char *__s;
  
  __s = "(null)";
  if (str != (char *)0x0) {
    __s = str;
  }
  sVar3 = strlen(__s);
  iVar2 = (int32_t)sVar3;
  if (U_ZERO_ERROR < *status) {
    __s = u_errorName_63(*status);
    sVar3 = strlen(__s);
    iVar2 = (int32_t)sVar3;
  }
  if (target != (char *)0x0) {
    iVar1 = uprv_min_63(iVar2,targetCapacity);
    strncpy(target,__s,(long)iVar1);
  }
  iVar2 = u_terminateChars_63(target,targetCapacity,iVar2,status);
  return iVar2;
}

Assistant:

static int32_t stringToStringBuffer(char *target, int32_t targetCapacity, const char *str, UErrorCode *status) {
  if(str==NULL) str=nullString;

  int32_t len = static_cast<int32_t>(uprv_strlen(str));
  if (U_SUCCESS(*status)) {
    if(target!=NULL) {
      uprv_strncpy(target,str,uprv_min(len,targetCapacity));
    }
  } else {
    const char *s = u_errorName(*status);
    len = static_cast<int32_t>(uprv_strlen(s));
    if(target!=NULL) {
      uprv_strncpy(target,s,uprv_min(len,targetCapacity));
    }
  }
  return u_terminateChars(target, targetCapacity, len, status);
}